

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::variable_decl_abi_cxx11_(CompilerMSL *this,SPIRVariable *variable)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RDX;
  bool old_is_using_builtin_array;
  SPIRVariable *variable_local;
  CompilerMSL *this_local;
  string *expr;
  
  bVar1 = *(byte *)((long)&variable[0x3f].dereference_chain.buffer_capacity + 2);
  uVar2 = (*(variable->super_IVariant)._vptr_IVariant[0x1c])(variable,in_RDX,4);
  if ((uVar2 & 1) != 0) {
    *(undefined1 *)((long)&variable[0x3f].dereference_chain.buffer_capacity + 2) = 1;
  }
  CompilerGLSL::variable_decl_abi_cxx11_(&this->super_CompilerGLSL,variable);
  *(byte *)((long)&variable[0x3f].dereference_chain.buffer_capacity + 2) = bVar1 & 1;
  return this;
}

Assistant:

std::string CompilerMSL::variable_decl(const SPIRVariable &variable)
{
	bool old_is_using_builtin_array = is_using_builtin_array;

	// Threadgroup arrays can't have a wrapper type.
	if (variable_decl_is_remapped_storage(variable, StorageClassWorkgroup))
		is_using_builtin_array = true;

	auto expr = CompilerGLSL::variable_decl(variable);
	is_using_builtin_array = old_is_using_builtin_array;
	return expr;
}